

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_fog_vol.cxx
# Opt level: O0

void __thiscall read_fog_vol::operator()(read_fog_vol *this,fog_vol_data **_fog_vol,xr_reader *r)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  fog_vol_data *this_00;
  ulong uVar3;
  fmatrix *pfVar4;
  fog_vol_data *fog_vol;
  xr_reader *r_local;
  fog_vol_data **_fog_vol_local;
  read_fog_vol *this_local;
  
  this_00 = (fog_vol_data *)operator_new(0x70);
  xray_re::fog_vol_data::fog_vol_data(this_00);
  *_fog_vol = this_00;
  xray_re::xr_reader::r_s(r,(string *)this_00);
  xray_re::xr_reader::r<xray_re::_matrix<float>>(r,&this_00->xform);
  uVar2 = xray_re::xr_reader::r_u32(r);
  this_00->num_particles = uVar2;
  if (uVar2 != 0) {
    auVar1 = ZEXT416(this_00->num_particles) * ZEXT816(0x40);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pfVar4 = (fmatrix *)operator_new__(uVar3);
    this_00->particles = pfVar4;
    xray_re::xr_reader::r_cseq<xray_re::_matrix<float>>
              (r,(ulong)this_00->num_particles,this_00->particles);
  }
  return;
}

Assistant:

void operator()(fog_vol_data*& _fog_vol, xr_reader& r) const {
	fog_vol_data* fog_vol = new fog_vol_data;
	_fog_vol = fog_vol;
	r.r_s(fog_vol->ltx);
	r.r(fog_vol->xform);
	if ((fog_vol->num_particles = r.r_u32())) {
		fog_vol->particles = new fmatrix[fog_vol->num_particles];
		r.r_cseq(fog_vol->num_particles, fog_vol->particles);
	}
}